

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assigner.hpp
# Opt level: O0

int __thiscall diy::ContiguousAssigner::rank(ContiguousAssigner *this,int gid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  Assigner *in_RDI;
  int r;
  int mod;
  int div;
  undefined4 local_4;
  
  iVar1 = diy::Assigner::nblocks(in_RDI);
  iVar2 = diy::Assigner::size(in_RDI);
  iVar1 = iVar1 / iVar2;
  iVar2 = diy::Assigner::nblocks(in_RDI);
  iVar3 = diy::Assigner::size(in_RDI);
  iVar2 = iVar2 % iVar3;
  local_4 = in_ESI / (iVar1 + 1);
  if (iVar2 <= local_4) {
    local_4 = iVar2 + (in_ESI - (iVar1 + 1) * iVar2) / iVar1;
  }
  return local_4;
}

Assistant:

int   rank(int gid) const override
      {
          int div = nblocks() / size();
          int mod = nblocks() % size();
          int r = gid / (div + 1);
          if (r < mod)
          {
              return r;
          } else
          {
              return mod + (gid - (div + 1)*mod)/div;
          }
      }